

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  char cVar1;
  byte bVar2;
  archive_entry *paVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  char *pcVar8;
  byte *name;
  byte *pbVar9;
  long lVar10;
  size_t sVar11;
  dev_t dVar12;
  size_t sVar13;
  int64_t iVar14;
  archive_string_conv *sc;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  archive_string *paVar18;
  uint uVar19;
  archive_entry *paVar20;
  uint uVar21;
  archive_string *paVar22;
  char *pcVar23;
  size_t sVar24;
  ulong uVar25;
  archive_entry *entry_00;
  char *pcVar26;
  byte *pbVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar34;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long n;
  int64_t s;
  wchar_t local_94;
  long local_88;
  time_t local_80;
  archive_string *local_78;
  archive_string *local_70;
  int64_t *local_68;
  archive_string *local_60;
  archive_string *local_58;
  wchar_t local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  wVar4 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar4 != L'\0') {
    return wVar4;
  }
  local_4c = tar_read_header(a,tar,entry,unconsumed);
  if ((local_4c != L'\0') && (local_4c != L'\xffffffec')) {
    return local_4c;
  }
  pcVar23 = (tar->pax_header).s;
  sVar24 = (tar->pax_header).length;
  tar->pax_hdrcharset_binary = 0;
  wVar4 = L'\0';
  (tar->entry_gname).length = 0;
  local_58 = &tar->entry_linkpath;
  (tar->entry_linkpath).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  local_60 = &tar->entry_uname;
  (tar->entry_uname).length = 0;
  paVar18 = &tar->entry_pathname;
  paVar22 = &tar->entry_gname;
  if (sVar24 != 0) {
    local_68 = &tar->sparse_offset;
    wVar4 = L'\0';
    uVar31 = 0x494843524142494c;
    uVar34 = 0x72747461782e4556;
    do {
      paVar20 = (archive_entry *)(pcVar23 + sVar24);
      pcVar8 = pcVar23 + (sVar24 - 1);
      uVar25 = 0;
      uVar16 = sVar24;
      pcVar26 = pcVar23;
      do {
        cVar1 = *pcVar26;
        if (cVar1 == ' ') {
          paVar20 = (archive_entry *)(pcVar26 + 1);
          pcVar8 = pcVar26;
          break;
        }
        if ((byte)(cVar1 - 0x3aU) < 0xf6) {
          pcVar23 = "Ignoring malformed pax extended attributes";
          goto LAB_0015b576;
        }
        uVar25 = (ulong)(byte)(cVar1 - 0x30) + uVar25 * 10;
        if (999999 < uVar25) {
          pcVar23 = "Rejecting pax extended attribute > 1MB";
          goto LAB_0015b576;
        }
        pcVar26 = pcVar26 + 1;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
      uVar16 = uVar25 - 1;
      if ((sVar24 <= uVar16) || (pcVar23[uVar16] != '\n')) {
        pcVar23 = "Ignoring malformed pax extended attribute";
LAB_0015b576:
        archive_set_error(&a->archive,-1,pcVar23);
        wVar7 = L'\xffffffec';
        goto LAB_0015b587;
      }
      pcVar23[uVar16] = '\0';
      if (*(char *)&paVar20->archive == '=') {
        wVar7 = L'\xffffffff';
        goto LAB_0015b587;
      }
      pcVar23 = pcVar23 + uVar25;
      pcVar26 = pcVar23 + (-2 - (long)paVar20);
      paVar3 = paVar20;
      while( true ) {
        entry_00 = (archive_entry *)((long)&paVar3->archive + 1);
        if (*(char *)&paVar3->archive == '\0') {
          pcVar23 = "Invalid pax extended attributes";
          goto LAB_0015b576;
        }
        if (*(char *)&paVar3->archive == '=') break;
        pcVar26 = pcVar26 + -1;
        paVar3 = entry_00;
      }
      *(char *)&paVar3->archive = '\0';
      bVar2 = *(byte *)&paVar20->archive;
      local_78 = paVar22;
      local_70 = paVar18;
      local_48 = uVar31;
      uStack_40 = uVar34;
      if (bVar2 < 0x53) {
        if (bVar2 == 0x47) {
          iVar5 = strncmp((char *)paVar20,"GNU.sparse",10);
          if ((iVar5 == 0) && (tar->sparse_allowed == 0)) {
            archive_set_error(&a->archive,-1,"Non-regular file cannot be sparse");
            goto LAB_0015b180;
          }
          iVar5 = strcmp((char *)paVar20,"GNU.sparse.numblocks");
          if (iVar5 == 0) {
            *(undefined4 *)local_68 = 0xffffffff;
            *(undefined4 *)((long)local_68 + 4) = 0xffffffff;
            *(undefined4 *)(local_68 + 1) = 0xffffffff;
            *(undefined4 *)((long)local_68 + 0xc) = 0xffffffff;
            tar->sparse_gnu_major = 0;
            tar->sparse_gnu_minor = 0;
          }
          iVar5 = strcmp((char *)paVar20,"GNU.sparse.offset");
          if (iVar5 == 0) {
            sVar13 = strlen((char *)entry_00);
            iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
            tar->sparse_offset = iVar14;
            if (tar->sparse_numbytes != -1) {
              wVar6 = gnu_add_sparse_entry(a,tar,iVar14,tar->sparse_numbytes);
              wVar7 = L'\xffffffe2';
              if (wVar6 != L'\0') goto LAB_0015b4f6;
              *(undefined4 *)local_68 = 0xffffffff;
              *(undefined4 *)((long)local_68 + 4) = 0xffffffff;
              *(undefined4 *)(local_68 + 1) = 0xffffffff;
              *(undefined4 *)((long)local_68 + 0xc) = 0xffffffff;
            }
          }
          iVar5 = strcmp((char *)paVar20,"GNU.sparse.numbytes");
          if (iVar5 == 0) {
            sVar13 = strlen((char *)entry_00);
            iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
            tar->sparse_numbytes = iVar14;
            if (tar->sparse_offset != -1) {
              wVar6 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar14);
              wVar7 = L'\xffffffe2';
              if (wVar6 != L'\0') goto LAB_0015b4f6;
              *(undefined4 *)local_68 = 0xffffffff;
              *(undefined4 *)((long)local_68 + 4) = 0xffffffff;
              *(undefined4 *)(local_68 + 1) = 0xffffffff;
              *(undefined4 *)((long)local_68 + 0xc) = 0xffffffff;
            }
          }
          iVar5 = strcmp((char *)paVar20,"GNU.sparse.size");
          if (iVar5 == 0) {
            sVar13 = strlen((char *)entry_00);
            iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
            tar->realsize = iVar14;
            archive_entry_set_size(entry,iVar14);
            tar->realsize_override = 1;
          }
          iVar5 = strcmp((char *)paVar20,"GNU.sparse.map");
          if (iVar5 == 0) {
            tar->sparse_gnu_major = 0;
            tar->sparse_gnu_minor = 1;
            wVar6 = gnu_sparse_01_parse(a,tar,(char *)entry_00);
            wVar7 = L'\xffffffec';
            if (wVar6 != L'\0') goto LAB_0015b4f6;
          }
          iVar5 = strcmp((char *)paVar20,"GNU.sparse.major");
          if (iVar5 == 0) {
            sVar13 = strlen((char *)entry_00);
            iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
            tar->sparse_gnu_major = (int)iVar14;
            tar->sparse_gnu_pending = '\x01';
          }
          iVar5 = strcmp((char *)paVar20,"GNU.sparse.minor");
          if (iVar5 == 0) {
            sVar13 = strlen((char *)entry_00);
            iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
            tar->sparse_gnu_minor = (int)iVar14;
            tar->sparse_gnu_pending = '\x01';
          }
          iVar5 = strcmp((char *)paVar20,"GNU.sparse.name");
          if (iVar5 == 0) {
            (tar->entry_pathname_override).length = 0;
            sVar13 = strlen((char *)entry_00);
            archive_strncat(&tar->entry_pathname_override,entry_00,sVar13);
          }
          iVar5 = strcmp((char *)paVar20,"GNU.sparse.realsize");
          if (iVar5 == 0) {
            sVar13 = strlen((char *)entry_00);
            iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
            tar->realsize = iVar14;
            archive_entry_set_size(entry,iVar14);
            tar->realsize_override = 1;
          }
        }
        else if (bVar2 == 0x4c) {
          local_94 = L'\0';
          iVar5 = strcmp((char *)paVar20,"LIBARCHIVE.creationtime");
          if (iVar5 == 0) {
            pax_time((char *)entry_00,&local_80,&local_88);
            archive_entry_set_birthtime(entry,local_80,local_88);
          }
          iVar5 = strcmp((char *)paVar20,"LIBARCHIVE.symlinktype");
          if (iVar5 == 0) {
            iVar5 = strcmp((char *)entry_00,"file");
            if (iVar5 == 0) {
              wVar7 = L'\x01';
            }
            else {
              iVar5 = strcmp((char *)entry_00,"dir");
              if (iVar5 != 0) goto LAB_0015afeb;
              wVar7 = L'\x02';
            }
            archive_entry_set_symlink_type(entry,wVar7);
          }
LAB_0015afeb:
          auVar29[0] = -(*(char *)&paVar20->archive == 'L');
          auVar29[1] = -(*(char *)((long)&paVar20->archive + 1) == 'I');
          auVar29[2] = -(*(char *)((long)&paVar20->archive + 2) == 'B');
          auVar29[3] = -(*(char *)((long)&paVar20->archive + 3) == 'A');
          auVar29[4] = -(*(char *)((long)&paVar20->archive + 4) == 'R');
          auVar29[5] = -(*(char *)((long)&paVar20->archive + 5) == 'C');
          auVar29[6] = -(*(char *)((long)&paVar20->archive + 6) == 'H');
          auVar29[7] = -(*(char *)((long)&paVar20->archive + 7) == 'I');
          auVar29[8] = -(*(char *)&paVar20->stat == 'V');
          auVar29[9] = -(*(char *)((long)&paVar20->stat + 1) == 'E');
          auVar29[10] = -(*(char *)((long)&paVar20->stat + 2) == '.');
          auVar29[0xb] = -(*(char *)((long)&paVar20->stat + 3) == 'x');
          auVar29[0xc] = -(*(char *)((long)&paVar20->stat + 4) == 'a');
          auVar29[0xd] = -(*(char *)((long)&paVar20->stat + 5) == 't');
          auVar29[0xe] = -(*(char *)((long)&paVar20->stat + 6) == 't');
          auVar29[0xf] = -(*(char *)((long)&paVar20->stat + 7) == 'r');
          auVar32[0] = -((char)paVar20->stat_valid == '.');
          auVar32[1] = 0xff;
          auVar32[2] = 0xff;
          auVar32[3] = 0xff;
          auVar32[4] = 0xff;
          auVar32[5] = 0xff;
          auVar32[6] = 0xff;
          auVar32[7] = 0xff;
          auVar32[8] = 0xff;
          auVar32[9] = 0xff;
          auVar32[10] = 0xff;
          auVar32[0xb] = 0xff;
          auVar32[0xc] = 0xff;
          auVar32[0xd] = 0xff;
          auVar32[0xe] = 0xff;
          auVar32[0xf] = 0xff;
          auVar32 = auVar32 & auVar29;
          if (((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff) &&
             (sVar13 = strlen((char *)paVar20), 0x11 < sVar13)) {
            auVar30[0] = -(*(char *)&paVar20->archive == (char)local_48);
            auVar30[1] = -(*(char *)((long)&paVar20->archive + 1) == local_48._1_1_);
            auVar30[2] = -(*(char *)((long)&paVar20->archive + 2) == local_48._2_1_);
            auVar30[3] = -(*(char *)((long)&paVar20->archive + 3) == local_48._3_1_);
            auVar30[4] = -(*(char *)((long)&paVar20->archive + 4) == local_48._4_1_);
            auVar30[5] = -(*(char *)((long)&paVar20->archive + 5) == local_48._5_1_);
            auVar30[6] = -(*(char *)((long)&paVar20->archive + 6) == local_48._6_1_);
            auVar30[7] = -(*(char *)((long)&paVar20->archive + 7) == local_48._7_1_);
            auVar30[8] = -(*(char *)&paVar20->stat == (char)uStack_40);
            auVar30[9] = -(*(char *)((long)&paVar20->stat + 1) == uStack_40._1_1_);
            auVar30[10] = -(*(char *)((long)&paVar20->stat + 2) == uStack_40._2_1_);
            auVar30[0xb] = -(*(char *)((long)&paVar20->stat + 3) == uStack_40._3_1_);
            auVar30[0xc] = -(*(char *)((long)&paVar20->stat + 4) == uStack_40._4_1_);
            auVar30[0xd] = -(*(char *)((long)&paVar20->stat + 5) == uStack_40._5_1_);
            auVar30[0xe] = -(*(char *)((long)&paVar20->stat + 6) == uStack_40._6_1_);
            auVar30[0xf] = -(*(char *)((long)&paVar20->stat + 7) == uStack_40._7_1_);
            auVar33[0] = -((char)paVar20->stat_valid == '.');
            auVar33[1] = 0xff;
            auVar33[2] = 0xff;
            auVar33[3] = 0xff;
            auVar33[4] = 0xff;
            auVar33[5] = 0xff;
            auVar33[6] = 0xff;
            auVar33[7] = 0xff;
            auVar33[8] = 0xff;
            auVar33[9] = 0xff;
            auVar33[10] = 0xff;
            auVar33[0xb] = 0xff;
            auVar33[0xc] = 0xff;
            auVar33[0xd] = 0xff;
            auVar33[0xe] = 0xff;
            auVar33[0xf] = 0xff;
            auVar33 = auVar33 & auVar30;
            if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) != 0xffff)
            goto switchD_0015a6ad_caseD_1;
            pbVar27 = (byte *)(pcVar8 + 0x12);
            sVar13 = strlen((char *)pbVar27);
            name = (byte *)malloc(sVar13 + 1);
            pbVar9 = name;
            if (name == (byte *)0x0) {
              name = (byte *)0x0;
            }
            else {
              while (*pbVar27 == 0x25) {
                iVar5 = (int)(char)pbVar27[1];
                if ((pbVar27[1] == 0) || (iVar15 = (int)(char)pbVar27[2], pbVar27[2] == 0))
                goto LAB_0015b12a;
                uVar19 = iVar5 - 0x30;
                if (9 < uVar19) {
                  if (iVar5 - 0x41U < 6) {
                    uVar19 = iVar5 - 0x37;
                  }
                  else {
                    uVar19 = iVar5 - 0x57;
                    if (5 < iVar5 - 0x61U) {
                      uVar19 = 0xffffffff;
                    }
                  }
                }
                uVar17 = iVar15 - 0x30;
                if (9 < uVar17) {
                  if (iVar15 - 0x41U < 6) {
                    uVar17 = iVar15 - 0x37;
                  }
                  else {
                    uVar17 = iVar15 - 0x57;
                    if (5 < iVar15 - 0x61U) {
                      uVar17 = 0xffffffff;
                    }
                  }
                }
                if (-1 < (int)(uVar19 | uVar17)) {
                  pbVar27 = pbVar27 + 3;
                  *pbVar9 = (byte)uVar17 | (byte)(uVar19 << 4);
                  pbVar9 = pbVar9 + 1;
                }
                if ((int)(uVar19 | uVar17) < 0) {
LAB_0015b12a:
                  bVar2 = *pbVar27;
                  pbVar27 = pbVar27 + 1;
                  *pbVar9 = bVar2;
                  pbVar9 = pbVar9 + 1;
                }
              }
              if (*pbVar27 != 0) goto LAB_0015b12a;
              *pbVar9 = 0;
            }
            if (name != (byte *)0x0) {
              sVar13 = strlen((char *)entry_00);
              if (base64_decode_decode_table[0x42] != '\x01') {
                base64_decode_decode_table._112_4_ = 0xffffffff;
                base64_decode_decode_table._116_4_ = 0xffffffff;
                base64_decode_decode_table._120_4_ = 0xffffffff;
                base64_decode_decode_table._124_4_ = 0xffffffff;
                base64_decode_decode_table._96_4_ = 0xffffffff;
                base64_decode_decode_table._100_4_ = 0xffffffff;
                base64_decode_decode_table._104_4_ = 0xffffffff;
                base64_decode_decode_table._108_4_ = 0xffffffff;
                base64_decode_decode_table._80_4_ = 0xffffffff;
                base64_decode_decode_table._84_4_ = 0xffffffff;
                base64_decode_decode_table._88_4_ = 0xffffffff;
                base64_decode_decode_table._92_4_ = 0xffffffff;
                base64_decode_decode_table._64_4_ = 0xffffffff;
                base64_decode_decode_table._68_4_ = 0xffffffff;
                base64_decode_decode_table._72_4_ = 0xffffffff;
                base64_decode_decode_table._76_4_ = 0xffffffff;
                base64_decode_decode_table._48_4_ = 0xffffffff;
                base64_decode_decode_table._52_4_ = 0xffffffff;
                base64_decode_decode_table._56_4_ = 0xffffffff;
                base64_decode_decode_table._60_4_ = 0xffffffff;
                base64_decode_decode_table._32_4_ = 0xffffffff;
                base64_decode_decode_table._36_4_ = 0xffffffff;
                base64_decode_decode_table._40_4_ = 0xffffffff;
                base64_decode_decode_table._44_4_ = 0xffffffff;
                base64_decode_decode_table._16_4_ = 0xffffffff;
                base64_decode_decode_table._20_4_ = 0xffffffff;
                base64_decode_decode_table._24_4_ = 0xffffffff;
                base64_decode_decode_table._28_4_ = 0xffffffff;
                base64_decode_decode_table._0_4_ = 0xffffffff;
                base64_decode_decode_table._4_4_ = 0xffffffff;
                base64_decode_decode_table._8_4_ = 0xffffffff;
                base64_decode_decode_table._12_4_ = 0xffffffff;
                lVar10 = 0;
                do {
                  base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar10]] = (char)lVar10;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 0x40);
              }
              pbVar27 = (byte *)malloc((sVar13 - (sVar13 >> 2)) + 1);
              pbVar9 = pbVar27;
              if (pbVar27 == (byte *)0x0) {
                sVar11 = 0;
                pbVar27 = (byte *)0x0;
              }
              else {
                while (sVar13 != 0) {
                  bVar28 = true;
                  uVar17 = 0;
                  paVar20 = entry_00;
                  uVar19 = 0;
                  do {
                    while( true ) {
                      entry_00 = paVar20;
                      sVar13 = sVar13 - 1;
                      bVar2 = *(byte *)&entry_00->archive;
                      if ((bVar2 == 0x3d) || (bVar2 == 0x5f)) {
                        sVar13 = 0;
                        goto LAB_0015b38a;
                      }
                      if (('\x1f' < (char)bVar2) &&
                         ((byte)base64_decode_decode_table[bVar2] != 0xff)) break;
                      entry_00 = (archive_entry *)((long)&entry_00->archive + 1);
                      paVar20 = entry_00;
                      if (!(bool)(sVar13 != 0 & bVar28)) goto LAB_0015b38a;
                    }
                    uVar17 = uVar17 << 6 | (uint)(byte)base64_decode_decode_table[bVar2];
                    uVar21 = uVar19 + 1;
                    bVar28 = uVar19 < 3;
                    uVar19 = uVar21;
                  } while ((bVar28) &&
                          (paVar20 = (archive_entry *)((long)&entry_00->archive + 1), sVar13 != 0));
                  entry_00 = (archive_entry *)((long)&entry_00->archive + 1);
LAB_0015b38a:
                  iVar5 = uVar17 << (('\x04' - (char)uVar19) * '\x06' & 0x1fU);
                  if (uVar19 == 2) {
LAB_0015b3ae:
                    *pbVar9 = (byte)((uint)iVar5 >> 0x10);
                  }
                  else {
                    if (uVar19 == 3) {
LAB_0015b3ab:
                      pbVar9[1] = (byte)((uint)iVar5 >> 8);
                      goto LAB_0015b3ae;
                    }
                    if (uVar19 == 4) {
                      pbVar9[2] = (byte)iVar5;
                      goto LAB_0015b3ab;
                    }
                  }
                  iVar5 = uVar19 * 3 + 3;
                  if (-1 < (int)(uVar19 * 3)) {
                    iVar5 = uVar19 * 3;
                  }
                  pbVar9 = pbVar9 + (iVar5 >> 2);
                }
                sVar11 = (long)pbVar9 - (long)pbVar27;
              }
              if (pbVar27 != (byte *)0x0) {
                archive_entry_xattr_add_entry(entry,(char *)name,pbVar27,sVar11);
                free(name);
                name = pbVar27;
              }
              free(name);
            }
          }
        }
        else {
          local_94 = L'\0';
          if (bVar2 != 0x52) goto switchD_0015a6ad_caseD_1;
          iVar5 = strcmp((char *)paVar20,"RHT.security.selinux");
          if (iVar5 == 0) {
            archive_entry_xattr_add_entry(entry,"security.selinux",entry_00,(size_t)pcVar26);
          }
        }
        goto LAB_0015b4ee;
      }
      pcVar8 = (char *)(ulong)(bVar2 - 0x61);
      local_94 = L'\0';
      switch(pcVar8) {
      case (char *)0x0:
        iVar5 = strcmp((char *)paVar20,"atime");
        if (iVar5 == 0) {
          pax_time((char *)entry_00,&local_80,&local_88);
          archive_entry_set_atime(entry,local_80,local_88);
        }
        break;
      case (char *)0x1:
      case (char *)0x3:
      case (char *)0x4:
      case (char *)0x5:
      case (char *)0x8:
      case (char *)0x9:
      case (char *)0xa:
      case (char *)0xd:
      case (char *)0xe:
      case (char *)0x10:
      case (char *)0x11:
      case (char *)0x13:
        goto switchD_0015a6ad_caseD_1;
      case (char *)0x2:
        iVar5 = strcmp((char *)paVar20,"ctime");
        if (iVar5 == 0) {
          pax_time((char *)entry_00,&local_80,&local_88);
          archive_entry_set_ctime(entry,local_80,local_88);
        }
        break;
      case (char *)0x6:
        iVar5 = strcmp((char *)paVar20,"gid");
        if (iVar5 == 0) {
          sVar13 = strlen((char *)entry_00);
          iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
          archive_entry_set_gid(entry,iVar14);
        }
        else {
          iVar5 = strcmp((char *)paVar20,"gname");
          if (iVar5 == 0) {
            (tar->entry_gname).length = 0;
            sVar11 = strlen((char *)entry_00);
            paVar18 = local_78;
LAB_0015adc9:
            archive_strncat(paVar18,entry_00,sVar11);
          }
        }
        break;
      case (char *)0x7:
        iVar5 = strcmp((char *)paVar20,"hdrcharset");
        if (iVar5 == 0) {
          iVar5 = strcmp((char *)entry_00,"BINARY");
          if (iVar5 == 0) {
            tar->pax_hdrcharset_binary = 1;
          }
          else {
            iVar5 = strcmp((char *)entry_00,"ISO-IR 10646 2000 UTF-8");
            if (iVar5 == 0) {
              tar->pax_hdrcharset_binary = 0;
            }
          }
        }
        break;
      case (char *)0xb:
        iVar5 = strcmp((char *)paVar20,"linkpath");
        if (iVar5 == 0) {
          (tar->entry_linkpath).length = 0;
          sVar11 = strlen((char *)entry_00);
          paVar18 = local_58;
LAB_0015ad69:
          archive_strncat(paVar18,entry_00,sVar11);
        }
        break;
      case (char *)0xc:
        iVar5 = strcmp((char *)paVar20,"mtime");
        if (iVar5 == 0) {
          pax_time((char *)entry_00,&local_80,&local_88);
          archive_entry_set_mtime(entry,local_80,local_88);
        }
        break;
      case (char *)0xf:
        iVar5 = strcmp((char *)paVar20,"path");
        if (iVar5 == 0) {
          (tar->entry_pathname).length = 0;
          sVar11 = strlen((char *)entry_00);
          paVar18 = local_70;
          goto LAB_0015ad69;
        }
        break;
      case (char *)0x12:
        iVar5 = strcmp((char *)paVar20,"size");
        if (iVar5 != 0) break;
        sVar13 = strlen((char *)entry_00);
        iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
        tar->entry_bytes_remaining = iVar14;
        if (iVar14 < 0) {
          tar->entry_bytes_remaining = 0;
          pcVar8 = "Tar size attribute is negative";
        }
        else {
          if (iVar14 != 0x7fffffffffffffff) {
            if (tar->realsize_override == 0) {
              archive_entry_set_size(entry,iVar14);
              tar->realsize = tar->entry_bytes_remaining;
            }
            break;
          }
          tar->entry_bytes_remaining = 0;
          pcVar8 = "Tar size attribute overflow";
        }
        archive_set_error(&a->archive,-1,pcVar8);
LAB_0015b180:
        wVar7 = L'\xffffffe2';
        goto LAB_0015b4f6;
      case (char *)0x14:
        iVar5 = strcmp((char *)paVar20,"uid");
        if (iVar5 == 0) {
          sVar13 = strlen((char *)entry_00);
          iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
          archive_entry_set_uid(entry,iVar14);
        }
        else {
          iVar5 = strcmp((char *)paVar20,"uname");
          if (iVar5 == 0) {
            (tar->entry_uname).length = 0;
            sVar11 = strlen((char *)entry_00);
            paVar18 = local_60;
            goto LAB_0015adc9;
          }
        }
        break;
      default:
        local_94 = L'\0';
        if (bVar2 == 0x53) {
          iVar5 = strcmp((char *)paVar20,"SCHILY.acl.access");
          if (iVar5 == 0) {
            wVar7 = L'Ā';
          }
          else {
            iVar5 = strcmp((char *)paVar20,"SCHILY.acl.default");
            if (iVar5 == 0) {
              wVar7 = L'Ȁ';
            }
            else {
              iVar5 = strcmp((char *)paVar20,"SCHILY.acl.ace");
              if (iVar5 != 0) {
                iVar5 = strcmp((char *)paVar20,"SCHILY.devmajor");
                if (iVar5 == 0) {
                  sVar13 = strlen((char *)entry_00);
                  dVar12 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
                  archive_entry_set_rdevmajor(entry,dVar12);
                }
                else {
                  iVar5 = strcmp((char *)paVar20,"SCHILY.devminor");
                  if (iVar5 == 0) {
                    sVar13 = strlen((char *)entry_00);
                    dVar12 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
                    archive_entry_set_rdevminor(entry,dVar12);
                  }
                  else {
                    iVar5 = strcmp((char *)paVar20,"SCHILY.fflags");
                    if (iVar5 == 0) {
                      archive_entry_copy_fflags_text(entry,(char *)entry_00);
                    }
                    else {
                      iVar5 = strcmp((char *)paVar20,"SCHILY.dev");
                      if (iVar5 == 0) {
                        sVar13 = strlen((char *)entry_00);
                        dVar12 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
                        archive_entry_set_dev(entry,dVar12);
                      }
                      else {
                        iVar5 = strcmp((char *)paVar20,"SCHILY.ino");
                        if (iVar5 == 0) {
                          sVar13 = strlen((char *)entry_00);
                          iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
                          archive_entry_set_ino(entry,iVar14);
                        }
                        else {
                          iVar5 = strcmp((char *)paVar20,"SCHILY.nlink");
                          if (iVar5 == 0) {
                            sVar13 = strlen((char *)entry_00);
                            iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
                            archive_entry_set_nlink(entry,(uint)iVar14);
                          }
                          else {
                            iVar5 = strcmp((char *)paVar20,"SCHILY.realsize");
                            if (iVar5 == 0) {
                              sVar13 = strlen((char *)entry_00);
                              iVar14 = tar_atol_base_n((char *)entry_00,sVar13,L'\n');
                              tar->realsize = iVar14;
                              tar->realsize_override = 1;
                              archive_entry_set_size(entry,iVar14);
                            }
                            else {
                              iVar5 = strncmp((char *)paVar20,"SCHILY.xattr.",0xd);
                              if (iVar5 == 0) {
                                pax_attribute_schily_xattr
                                          (entry,(char *)paVar20,(char *)entry_00,(size_t)pcVar26);
                              }
                              else {
                                iVar5 = strcmp((char *)paVar20,"SUN.holesdata");
                                if (iVar5 == 0) {
                                  wVar6 = solaris_sparse_parse(a,tar,entry_00,pcVar8);
                                  if (wVar6 < L'\0') {
                                    wVar7 = L'\xffffffe2';
                                    if (wVar6 == L'\xffffffe2') goto LAB_0015b4f6;
                                    archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata");
                                    local_94 = wVar6;
                                  }
                                  goto switchD_0015a6ad_caseD_1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                break;
              }
              wVar7 = L'㰀';
            }
          }
          wVar6 = pax_attribute_acl(a,tar,entry,(char *)entry_00,wVar7);
          wVar7 = L'\xffffffe2';
          if (wVar6 == L'\xffffffe2') goto LAB_0015b4f6;
        }
        goto switchD_0015a6ad_caseD_1;
      }
LAB_0015b4ee:
      local_94 = L'\0';
switchD_0015a6ad_caseD_1:
      wVar7 = local_94;
LAB_0015b4f6:
      if (wVar7 == L'\xffffffe2') goto LAB_0015b79e;
      if (wVar7 <= wVar4) {
        wVar4 = wVar7;
      }
      sVar24 = sVar24 - uVar25;
      paVar18 = local_70;
      paVar22 = local_78;
      uVar31 = local_48;
      uVar34 = uStack_40;
    } while (sVar24 != 0);
  }
  local_78 = paVar22;
  local_70 = paVar18;
  if (tar->pax_hdrcharset_binary == 0) {
    sc = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (sc == (archive_string_conv *)0x0) {
LAB_0015b79e:
      wVar7 = L'\xffffffe2';
      goto LAB_0015b587;
    }
    if (tar->compat_2x != 0) {
      archive_string_conversion_set_opt(sc,L'\x01');
    }
  }
  else {
    sc = tar->opt_sconv;
  }
  sVar24 = (tar->entry_gname).length;
  if ((sVar24 != 0) &&
     (wVar7 = _archive_entry_copy_gname_l(entry,local_78->s,sVar24,sc), wVar7 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,sc,"Gname");
    wVar7 = L'\xffffffe2';
    if (wVar4 == L'\xffffffe2') goto LAB_0015b587;
    archive_entry_copy_gname(entry,local_78->s);
  }
  sVar24 = (tar->entry_linkpath).length;
  if ((sVar24 != 0) &&
     (wVar7 = _archive_entry_copy_link_l(entry,local_58->s,sVar24,sc), wVar7 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,sc,"Linkname");
    wVar7 = L'\xffffffe2';
    if (wVar4 == L'\xffffffe2') goto LAB_0015b587;
    archive_entry_copy_link(entry,local_58->s);
  }
  paVar18 = &tar->entry_pathname_override;
  if (((tar->entry_pathname_override).length == 0) &&
     (paVar18 = local_70, (tar->entry_pathname).length == 0)) {
    paVar18 = (archive_string *)0x0;
  }
  wVar7 = wVar4;
  if ((paVar18 != (archive_string *)0x0) &&
     (wVar4 = _archive_entry_copy_pathname_l(entry,paVar18->s,paVar18->length,sc), wVar4 != L'\0'))
  {
    wVar4 = set_conversion_failed_error(a,sc,"Pathname");
    wVar7 = L'\xffffffe2';
    if (wVar4 == L'\xffffffe2') goto LAB_0015b587;
    archive_entry_copy_pathname(entry,paVar18->s);
    wVar7 = wVar4;
  }
  sVar24 = (tar->entry_uname).length;
  if ((sVar24 != 0) &&
     (wVar4 = _archive_entry_copy_uname_l(entry,local_60->s,sVar24,sc), wVar4 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,sc,"Uname");
    wVar7 = L'\xffffffe2';
    if (wVar4 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,local_60->s);
      wVar7 = wVar4;
    }
  }
LAB_0015b587:
  if (local_4c < wVar7) {
    wVar7 = local_4c;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return wVar7;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, &tar->pax_header);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}